

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O1

bool __thiscall camp::UserObject::operator==(UserObject *this,UserObject *other)

{
  element_type *peVar1;
  ParentObject *pPVar2;
  ParentObject *pPVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  while( true ) {
    peVar1 = (((ParentObject *)this)->object).m_holder.
             super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       ((((shared_ptr<camp::detail::AbstractObjectHolder> *)
         ((long)&((ParentObject *)other)->object + 8))->
        super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        != (element_type *)0x0)) {
      iVar4 = (*peVar1->_vptr_AbstractObjectHolder[2])(peVar1);
      iVar5 = (*((((ParentObject *)other)->object).m_holder.
                 super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_AbstractObjectHolder[2])();
      return CONCAT44(extraout_var,iVar4) == CONCAT44(extraout_var_00,iVar5);
    }
    pPVar2 = (((ParentObject *)this)->object).m_parent.px;
    if ((pPVar2 == (ParentObject *)0x0) ||
       (pPVar3 = ((scoped_ptr<camp::ParentObject> *)((long)&((ParentObject *)other)->object + 0x18))
                 ->px, pPVar3 == (ParentObject *)0x0)) break;
    other = &pPVar3->object;
    this = &pPVar2->object;
    if (pPVar2->member != pPVar3->member) {
      return false;
    }
  }
  return (((ParentObject *)other)->object).m_class == (Class *)0x0 &&
         (((ParentObject *)this)->object).m_class == (Class *)0x0;
}

Assistant:

bool UserObject::operator==(const UserObject& other) const
{
    if (m_holder && other.m_holder)
    {
        return m_holder->object() == other.m_holder->object();
    }
    else if (m_parent && other.m_parent)
    {
        return (&m_parent->member == &other.m_parent->member) && (m_parent->object == other.m_parent->object);
    }
    else if (!m_class && !other.m_class)
    {
        // Both are UserObject::nothing
        return true;
    }
    else
    {
        return false;
    }
}